

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::packColumns(CLUFactor<double> *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  Col *pCVar6;
  int *l_cbeg;
  int *l_cmax;
  int *l_clen;
  int *l_cidx;
  Dring *list;
  Dring *ring;
  int l_col;
  int j;
  int i;
  int n;
  CLUFactor<double> *this_local;
  
  piVar1 = (this->u).col.idx;
  piVar2 = (this->u).col.len;
  piVar3 = (this->u).col.max;
  piVar4 = (this->u).col.start;
  n = 0;
  pCVar6 = &(this->u).col;
  for (ring = (pCVar6->list).next; (Col *)ring != pCVar6; ring = ring->next) {
    iVar5 = ring->idx;
    if (piVar4[iVar5] != n) goto LAB_00258ce8;
    n = piVar2[iVar5] + n;
    piVar3[iVar5] = piVar2[iVar5];
  }
LAB_00258de3:
  (this->u).col.used = n;
  (this->u).col.max[this->thedim] = 0;
  return;
LAB_00258ce8:
  do {
    iVar5 = ring->idx;
    i = piVar4[iVar5];
    piVar4[iVar5] = n;
    piVar3[iVar5] = piVar2[iVar5];
    iVar5 = i + piVar2[iVar5];
    for (; i < iVar5; i = i + 1) {
      piVar1[n] = piVar1[i];
      n = n + 1;
    }
    ring = ring->next;
  } while ((Col *)ring != pCVar6);
  goto LAB_00258de3;
}

Assistant:

void CLUFactor<R>::packColumns()
{
   int n, i, j, l_col;
   Dring* ring, *list;

   int* l_cidx = u.col.idx;
   int* l_clen = u.col.len;
   int* l_cmax = u.col.max;
   int* l_cbeg = u.col.start;

   n = 0;
   list = &(u.col.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_col = ring->idx;

      if(l_cbeg[l_col] != n)
      {
         do
         {
            l_col = ring->idx;
            i = l_cbeg[l_col];
            l_cbeg[l_col] = n;
            l_cmax[l_col] = l_clen[l_col];
            j = i + l_clen[l_col];

            for(; i < j; ++i)
               l_cidx[n++] = l_cidx[i];

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackColumns;
      }

      n += l_clen[l_col];

      l_cmax[l_col] = l_clen[l_col];
   }

terminatePackColumns :

   u.col.used = n;
   u.col.max[thedim] = 0;
}